

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O3

void __thiscall Memory::HeapBlockMap32::~HeapBlockMap32(HeapBlockMap32 *this)

{
  L2MapChunk *this_00;
  HeapAllocator *this_01;
  long lVar1;
  
  lVar1 = 0;
  do {
    this_00 = this->map[lVar1];
    if (this_00 != (L2MapChunk *)0x0) {
      this_01 = HeapAllocator::GetNoMemProtectInstance();
      L2MapChunk::~L2MapChunk(this_00);
      HeapAllocator::Free(this_01,this_00,0x2c08);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x1000);
  return;
}

Assistant:

HeapBlockMap32::~HeapBlockMap32()
{
    for (uint i = 0; i < _countof(map); i++)
    {
        L2MapChunk * chunk = map[i];
        if (chunk)
        {
            NoMemProtectHeapDelete(chunk);
        }
    }
}